

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int nghttp2_session_update_recv_connection_window_size(nghttp2_session *session,size_t delta_size)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = session->recv_window_size;
  uVar1 = (uint)delta_size;
  if ((int)(uVar1 ^ 0x7fffffff) < iVar2 || (int)(session->local_window_size - uVar1) < iVar2) {
    iVar2 = nghttp2_session_terminate_session(session,3);
    return iVar2;
  }
  session->recv_window_size = iVar2 + uVar1;
  iVar3 = 0;
  if (((session->opt_flags & 1) == 0) && (iVar3 = 0, session->window_update_queued == '\0')) {
    iVar2 = nghttp2_should_send_window_update(session->local_window_size,iVar2 + uVar1);
    if (iVar2 != 0) {
      iVar3 = nghttp2_session_add_window_update(session,'\0',0,session->recv_window_size);
      if (iVar3 == 0) {
        session->recv_window_size = 0;
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int nghttp2_session_update_recv_connection_window_size(nghttp2_session *session,
                                                       size_t delta_size) {
  int rv;
  rv = adjust_recv_window_size(&session->recv_window_size, delta_size,
                               session->local_window_size);
  if (rv != 0) {
    return nghttp2_session_terminate_session(session,
                                             NGHTTP2_FLOW_CONTROL_ERROR);
  }
  if (!(session->opt_flags & NGHTTP2_OPTMASK_NO_AUTO_WINDOW_UPDATE) &&
      session->window_update_queued == 0 &&
      nghttp2_should_send_window_update(session->local_window_size,
                                        session->recv_window_size)) {
    /* Use stream ID 0 to update connection-level flow control
       window */
    rv = nghttp2_session_add_window_update(session, NGHTTP2_FLAG_NONE, 0,
                                           session->recv_window_size);
    if (rv != 0) {
      return rv;
    }

    session->recv_window_size = 0;
  }
  return 0;
}